

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsh_cmd_array.c
# Opt level: O0

nsh_status_t nsh_cmd_array_register(nsh_cmd_array_t *cmds,char *name,nsh_cmd_handler_t *handler)

{
  nsh_cmd_handler_t *handler_local;
  char *name_local;
  nsh_cmd_array_t *cmds_local;
  
  if (cmds->count < 0x20) {
    nsh_cmd_init(cmds->array + cmds->count,name,handler);
    cmds->count = cmds->count + 1;
    cmds_local._4_4_ = NSH_STATUS_OK;
  }
  else {
    cmds_local._4_4_ = NSH_STATUS_MAX_CMD_NB_REACH;
  }
  return cmds_local._4_4_;
}

Assistant:

nsh_status_t nsh_cmd_array_register(nsh_cmd_array_t* cmds, const char* name, nsh_cmd_handler_t* handler)
{
    if (cmds->count >= NSH_CMD_MAX_COUNT) {
        // If we have reached the max cmd count, ignore all registration request
        return NSH_STATUS_MAX_CMD_NB_REACH;
    }

    nsh_cmd_init(&cmds->array[cmds->count], name, handler);

    cmds->count++;

    return NSH_STATUS_OK;
}